

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

HDRImageBuffer * load_exr(char *file_path)

{
  ostream *poVar1;
  HDRImageBuffer *this;
  reference pvVar2;
  Spectrum local_10d4;
  ulong local_10c8;
  size_t i_1;
  float *channel_b;
  float *channel_g;
  float *channel_r;
  HDRImageBuffer *local_1098;
  HDRImageBuffer *envmap;
  int i;
  int ret;
  EXRImage exr;
  char *err;
  char *file_path_local;
  
  InitEXRImage((EXRImage *)&i);
  envmap._4_4_ = ParseMultiChannelEXRHeaderFromFile
                           ((EXRImage *)&i,file_path,(char **)&exr.screen_window_width);
  if (envmap._4_4_ == 0) {
    for (envmap._0_4_ = 0; (int)envmap < exr.custom_attributes[0x7f].value._4_4_;
        envmap._0_4_ = (int)envmap + 1) {
      if (*(int *)((long)exr.images + (long)(int)envmap * 4) == 1) {
        exr.pixel_types[(int)envmap] = 2;
      }
    }
    envmap._4_4_ = LoadMultiChannelEXRFromFile
                             ((EXRImage *)&i,file_path,(char **)&exr.screen_window_width);
    if (envmap._4_4_ != 0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
      poVar1 = std::operator<<(poVar1,"Error loading OpenEXR file: ");
      poVar1 = std::operator<<(poVar1,(char *)exr._4192_8_);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    this = (HDRImageBuffer *)operator_new(0x28);
    CMU462::HDRImageBuffer::HDRImageBuffer(this);
    local_1098 = this;
    CMU462::HDRImageBuffer::resize
              (this,(long)(int)exr.requested_pixel_types,(long)exr.requested_pixel_types._4_4_);
    channel_g = (float *)exr.channel_names[2];
    channel_b = (float *)exr.channel_names[1];
    i_1 = (size_t)*exr.channel_names;
    for (local_10c8 = 0;
        local_10c8 < (ulong)(long)((int)exr.requested_pixel_types * exr.requested_pixel_types._4_4_)
        ; local_10c8 = local_10c8 + 1) {
      CMU462::Spectrum::Spectrum
                (&local_10d4,channel_g[local_10c8],channel_b[local_10c8],
                 *(float *)(i_1 + local_10c8 * 4));
      pvVar2 = std::vector<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>::operator[]
                         (&local_1098->data,local_10c8);
      pvVar2->r = local_10d4.r;
      pvVar2->g = local_10d4.g;
      pvVar2->b = local_10d4.b;
    }
    file_path_local = (char *)local_1098;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
    poVar1 = std::operator<<(poVar1,"Error parsing OpenEXR file: ");
    poVar1 = std::operator<<(poVar1,(char *)exr._4192_8_);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    file_path_local = (char *)0x0;
  }
  return (HDRImageBuffer *)file_path_local;
}

Assistant:

HDRImageBuffer* load_exr(const char* file_path) {

  const char* err;

  EXRImage exr;
  InitEXRImage(&exr);

  int ret = ParseMultiChannelEXRHeaderFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error parsing OpenEXR file: " << err);
    return NULL;
  }

  for (int i = 0; i < exr.num_channels; i++) {
    if (exr.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  ret = LoadMultiChannelEXRFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error loading OpenEXR file: " << err);
    exit(EXIT_FAILURE);
  }

  HDRImageBuffer* envmap = new HDRImageBuffer();
  envmap->resize(exr.width, exr.height);
  float* channel_r = (float*) exr.images[2];
  float* channel_g = (float*) exr.images[1];
  float* channel_b = (float*) exr.images[0];
  for (size_t i = 0; i < exr.width * exr.height; i++) {
    envmap->data[i] = Spectrum(channel_r[i], 
        channel_g[i], 
        channel_b[i]);
  }

  return envmap;
}